

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::ProfileObjectLiteral(ScriptContext *this)

{
  int i;
  ulong uVar1;
  
  Output::Print(L"===============================================================================\n"
               );
  Output::Print(L"    Object Lit Instances created.. %d\n",
                (ulong)(uint)this->objectLiteralInstanceCount);
  Output::Print(L"    Object Lit Path Types......... %d\n",(ulong)(uint)this->objectLiteralPathCount
               );
  Output::Print(L"    Object Lit Simple Map......... %d\n",
                (ulong)(uint)this->objectLiteralSimpleDictionaryCount);
  Output::Print(L"    Object Lit Max # of properties %d\n",(ulong)this->objectLiteralMaxLength);
  Output::Print(L"    Object Lit Promote count...... %d\n",
                (ulong)(uint)this->objectLiteralPromoteCount);
  Output::Print(L"    Object Lit Cache Hits......... %d\n",
                (ulong)(uint)this->objectLiteralCacheCount);
  Output::Print(L"    Object Lit Branch count....... %d\n",
                (ulong)(uint)this->objectLiteralBranchCount);
  for (uVar1 = 0; uVar1 != 0x80; uVar1 = uVar1 + 1) {
    if (this->objectLiteralCount[uVar1] != 0) {
      Output::Print(L"    Object Lit properties [ %2d] .. %d\n",uVar1 & 0xffffffff);
    }
  }
  Output::Flush();
  return;
}

Assistant:

void ScriptContext::ProfileObjectLiteral()
    {
        Output::Print(_u("===============================================================================\n"));
        Output::Print(_u("    Object Lit Instances created.. %d\n"), objectLiteralInstanceCount);
        Output::Print(_u("    Object Lit Path Types......... %d\n"), objectLiteralPathCount);
        Output::Print(_u("    Object Lit Simple Map......... %d\n"), objectLiteralSimpleDictionaryCount);
        Output::Print(_u("    Object Lit Max # of properties %d\n"), objectLiteralMaxLength);
        Output::Print(_u("    Object Lit Promote count...... %d\n"), objectLiteralPromoteCount);
        Output::Print(_u("    Object Lit Cache Hits......... %d\n"), objectLiteralCacheCount);
        Output::Print(_u("    Object Lit Branch count....... %d\n"), objectLiteralBranchCount);

        for (int i = 0; i < TypePath::MaxPathTypeHandlerLength; i++)
        {
            if (objectLiteralCount[i] != 0)
            {
                Output::Print(_u("    Object Lit properties [ %2d] .. %d\n"), i, objectLiteralCount[i]);
            }
        }

        Output::Flush();
    }